

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall
helics::apps::App::App
          (App *this,string_view defaultAppName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  FederateInfo *in_RCX;
  undefined8 *in_RDI;
  FederateInfo fedInfo;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  FederateInfo *in_stack_fffffffffffffe60;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_fffffffffffffe68;
  App *in_stack_fffffffffffffe70;
  string_view in_stack_fffffffffffffe78;
  App *in_stack_fffffffffffffe88;
  helicsCLI11App *in_stack_fffffffffffffe90;
  
  *in_RDI = &PTR__App_009be658;
  CLI::std::shared_ptr<helics::CombinationFederate>::shared_ptr
            ((shared_ptr<helics::CombinationFederate> *)0x248125);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[3] = TVar1.internalTimeCode;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 4);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  *(undefined1 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x81) = 0;
  *(undefined1 *)((long)in_RDI + 0x82) = 0;
  *(undefined1 *)((long)in_RDI + 0x83) = 0;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2481a0);
  generateParser((App *)fedInfo.super_CoreFederateInfo.timeProps.
                        super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FederateInfo::FederateInfo(in_stack_fffffffffffffe60);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
            ((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             in_RCX);
  FederateInfo::injectParser((FederateInfo *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x2481ed);
  helicsCLI11App::
  helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffe90,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffe88);
  processArgs(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe78);
  FederateInfo::~FederateInfo(in_RCX);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              this_00);
  return;
}

Assistant:

App::App(std::string_view defaultAppName, std::vector<std::string> args)
{
    auto app = generateParser();
    FederateInfo fedInfo;
    fedInfo.injectParser(app.get());
    app->helics_parse(std::move(args));
    processArgs(app, fedInfo, defaultAppName);
}